

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d.c
# Opt level: O2

int parse_at(envy_bios *bios,envy_bios_p *p,int idx,int offset,char **name)

{
  byte bVar1;
  int iVar2;
  envy_bios_p_falcon_ucode **ppeVar3;
  envy_bios_bit_entry *peVar4;
  char **ppcVar5;
  uint uVar6;
  envy_bios_p_falcon_ucode **ppeVar7;
  envy_bios_p_falcon_ucode *local_50;
  undefined1 local_48 [8];
  char *local_40;
  char *local_38;
  envy_bios_p_falcon_ucode *local_30;
  uint32_t tblOffset;
  
  local_48[0] = 0;
  local_30 = &p->falcon_ucode;
  local_38 = "FALCON UCODE";
  peVar4 = p->bit;
  iVar2 = -0x16;
  if (peVar4->version == '\x01') {
    uVar6 = 0;
    ppcVar5 = &local_40;
    ppeVar7 = (envy_bios_p_falcon_ucode **)local_48;
    ppeVar3 = &local_50;
  }
  else {
    if (peVar4->version != '\x02') {
      return -0x16;
    }
    uVar6 = 1;
    ppeVar3 = (envy_bios_p_falcon_ucode **)local_48;
    ppeVar7 = &local_30;
    ppcVar5 = &local_38;
  }
  if (idx == -1 || offset == -1) {
    if (-1 < offset) {
      idx = 0;
      do {
        if (uVar6 <= (uint)idx) goto LAB_0025fdeb;
        idx = 1;
      } while ((uint)*(byte *)ppeVar3 != offset);
      idx = 0;
    }
LAB_0025fdeb:
    iVar2 = -2;
    if (((uint)idx < uVar6) && (bVar1 = *(byte *)ppeVar3, (ushort)(bVar1 + 2) <= peVar4->t_len)) {
      if (name != (char **)0x0) {
        *name = *ppcVar5;
        peVar4 = p->bit;
      }
      iVar2 = bios_u32(bios,(uint)peVar4->t_offset + (uint)bVar1,&tblOffset);
      (*ppeVar7)->offset = (uint16_t)tblOffset;
    }
  }
  return iVar2;
}

Assistant:

static int
parse_at(struct envy_bios *bios, unsigned int idx, const char **name)
{
	struct envy_bios_d *d = &bios->d;
	struct d_known_tables tbls[] = {
		{ 0x0, &d->dp_info.offset, "DP INFO" },
	};
	int entries_count = (sizeof(tbls) / sizeof(struct d_known_tables));

	/* check the index */
	if (idx >= entries_count)
		return -ENOENT;

	/* check the table has the right size */
	if (tbls[idx].offset + 2 > d->bit->t_len)
		return -ENOENT;

	if (name)
		*name = tbls[idx].name;

	return bios_u16(bios, d->bit->t_offset + tbls[idx].offset, tbls[idx].ptr);
}